

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSign.c
# Opt level: O3

double * Cudd_CofMinterm(DdManager *dd,DdNode *node)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  st__table *table;
  double *__ptr;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
    lVar4 = 0x268;
  }
  else {
    size = dd->size;
    __ptr = ddCofMintermAux(dd,node,table);
    iVar3 = size;
    if (__ptr == (double *)0x0) {
      pdVar5 = (double *)0x0;
    }
    else {
      uVar9 = (ulong)(uint)size;
      lVar4 = (long)size;
      pdVar5 = (double *)malloc(lVar4 * 8 + 8);
      if (pdVar5 == (double *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        uVar1 = *(uint *)((ulong)node & 0xfffffffffffffffe);
        uVar6 = (ulong)uVar1;
        iVar8 = 1;
        if (uVar6 != 0x7fffffff) {
          iVar8 = dd->perm[uVar6];
        }
        if (iVar3 < 1) {
          lVar7 = (long)(iVar3 - iVar8);
        }
        else {
          lVar7 = (long)(iVar3 - iVar8);
          piVar2 = dd->invperm;
          uVar10 = 0;
          do {
            lVar11 = 0x7fffffff;
            if (uVar1 != 0x7fffffff) {
              lVar11 = (long)dd->perm[uVar6];
            }
            lVar12 = lVar7;
            if (lVar11 <= (long)uVar10) {
              lVar12 = uVar10 - (long)iVar8;
            }
            pdVar5[piVar2[uVar10]] = __ptr[lVar12];
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
        pdVar5[lVar4] = __ptr[lVar7];
      }
      if (*(int *)(((ulong)node & 0xfffffffffffffffe) + 4) == 1) {
        free(__ptr);
      }
    }
    st__foreach(table,cuddStCountfree,(char *)0x0);
    st__free_table(table);
    if (pdVar5 != (double *)0x0) {
      return pdVar5;
    }
    lVar4 = 0x260;
  }
  fwrite("out-of-memory, couldn\'t measure DD cofactors.\n",0x2e,1,
         *(FILE **)((long)&(dd->sentinel).index + lVar4));
  dd->errorCode = CUDD_MEMORY_OUT;
  return (double *)0x0;
}

Assistant:

double *
Cudd_CofMinterm(
  DdManager * dd,
  DdNode * node)
{
    st__table    *table;
    double      *values;
    double      *result = NULL;
    int         i, firstLevel;

#ifdef DD_STATS
    long startTime;
    startTime = util_cpu_time();
    num_calls = 0;
    table_mem = sizeof( st__table);
#endif

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) {
        (void) fprintf(dd->err,
                       "out-of-memory, couldn't measure DD cofactors.\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    size = dd->size;
    values = ddCofMintermAux(dd, node, table);
    if (values != NULL) {
        result = ABC_ALLOC(double,size + 1);
        if (result != NULL) {
#ifdef DD_STATS
            table_mem += (size + 1) * sizeof(double);
#endif
            if (Cudd_IsConstant(node))
                firstLevel = 1;
            else
                firstLevel = cuddI(dd,Cudd_Regular(node)->index);
            for (i = 0; i < size; i++) {
                if (i >= cuddI(dd,Cudd_Regular(node)->index)) {
                    result[dd->invperm[i]] = values[i - firstLevel];
                } else {
                    result[dd->invperm[i]] = values[size - firstLevel];
                }
            }
            result[size] = values[size - firstLevel];
        } else {
            dd->errorCode = CUDD_MEMORY_OUT;
        }
    }

#ifdef DD_STATS
    table_mem += table->num_bins * sizeof( st__table_entry *);
#endif
    if (Cudd_Regular(node)->ref == 1) ABC_FREE(values);
    st__foreach(table, cuddStCountfree, NULL);
    st__free_table(table);
#ifdef DD_STATS
    (void) fprintf(dd->out,"Number of calls: %d\tTable memory: %d bytes\n",
                  num_calls, table_mem);
    (void) fprintf(dd->out,"Time to compute measures: %s\n",
                  util_print_time(util_cpu_time() - startTime));
#endif
    if (result == NULL) {
        (void) fprintf(dd->out,
                       "out-of-memory, couldn't measure DD cofactors.\n");
        dd->errorCode = CUDD_MEMORY_OUT;
    }
    return(result);

}